

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O2

void LabelDict::del_example_namespace(example *ec,namespace_index ns,features *fs)

{
  uchar *puVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  long lVar3;
  features *this;
  
  uVar2 = CONCAT71(in_register_00000031,ns) & 0xffffffff;
  this = (ec->super_example_predict).feature_space + uVar2;
  puVar1 = (ec->super_example_predict).indices._end;
  lVar3 = (long)(ec->super_example_predict).feature_space[uVar2].values._end -
          (long)(this->values)._begin;
  if ((puVar1[-1] == ns) && (lVar3 == (long)(fs->values)._end - (long)(fs->values)._begin)) {
    (ec->super_example_predict).indices._end = puVar1 + -1;
  }
  ec->total_sum_feat_sq = ec->total_sum_feat_sq - fs->sum_feat_sq;
  ec->num_features = ec->num_features - ((long)(fs->values)._end - (long)(fs->values)._begin >> 2);
  features::truncate_to
            (this,(lVar3 >> 2) - ((long)(fs->values)._end - (long)(fs->values)._begin >> 2));
  (ec->super_example_predict).feature_space[uVar2].sum_feat_sq =
       (ec->super_example_predict).feature_space[uVar2].sum_feat_sq - fs->sum_feat_sq;
  return;
}

Assistant:

void del_example_namespace(example& ec, namespace_index ns, features& fs)
{
  // print_update is called after this del_example_namespace,
  // so we need to keep the ec.num_features correct,
  // so shared features are included in the reported number of "current features"
  // ec.num_features -= numf;
  features& del_target = ec.feature_space[(size_t)ns];
  assert(del_target.size() >= fs.size());
  assert(ec.indices.size() > 0);
  if (ec.indices.last() == ns && ec.feature_space[(size_t)ns].size() == fs.size())
    ec.indices.pop();
  ec.total_sum_feat_sq -= fs.sum_feat_sq;
  ec.num_features -= fs.size();
  del_target.truncate_to(del_target.size() - fs.size());
  del_target.sum_feat_sq -= fs.sum_feat_sq;
}